

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int emit_break(JSParseState *s,JSAtom name,int is_cont)

{
  char *fmt;
  BlockEnv *pBVar1;
  int iVar2;
  int scope;
  
  pBVar1 = s->cur_func->top_break;
  if (pBVar1 != (BlockEnv *)0x0) {
    scope = s->cur_func->scope_level;
    do {
      close_scopes(s,scope,pBVar1->scope_level);
      scope = pBVar1->scope_level;
      if (is_cont == 0) {
        iVar2 = pBVar1->label_break;
      }
      else {
        iVar2 = pBVar1->label_cont;
      }
      if ((iVar2 != -1) && ((name == 0 || (pBVar1->label_name == name)))) {
        emit_goto(s,0x6b,iVar2);
        return 0;
      }
      if (pBVar1->has_iterator == 0) {
        iVar2 = 0;
      }
      else {
        emit_op(s,0x83);
        iVar2 = 3;
      }
      for (; iVar2 < pBVar1->drop_count; iVar2 = iVar2 + 1) {
        emit_op(s,'\x0e');
      }
      if (pBVar1->label_finally != -1) {
        emit_op(s,'\x06');
        emit_goto(s,0x6d,pBVar1->label_finally);
        emit_op(s,'\x0e');
      }
      pBVar1 = pBVar1->prev;
    } while (pBVar1 != (BlockEnv *)0x0);
  }
  if (name == 0) {
    if (is_cont == 0) {
      fmt = "break must be inside loop or switch";
    }
    else {
      fmt = "continue must be inside loop";
    }
  }
  else {
    fmt = "break/continue label not found";
  }
  js_parse_error(s,fmt);
  return -1;
}

Assistant:

static __exception int emit_break(JSParseState *s, JSAtom name, int is_cont)
{
    BlockEnv *top;
    int i, scope_level;

    scope_level = s->cur_func->scope_level;
    top = s->cur_func->top_break;
    while (top != NULL) {
        close_scopes(s, scope_level, top->scope_level);
        scope_level = top->scope_level;
        if (is_cont &&
            top->label_cont != -1 &&
            (name == JS_ATOM_NULL || top->label_name == name)) {
            /* continue stays inside the same block */
            emit_goto(s, OP_goto, top->label_cont);
            return 0;
        }
        if (!is_cont &&
            top->label_break != -1 &&
            (name == JS_ATOM_NULL || top->label_name == name)) {
            emit_goto(s, OP_goto, top->label_break);
            return 0;
        }
        i = 0;
        if (top->has_iterator) {
            emit_op(s, OP_iterator_close);
            i += 3;
        }
        for(; i < top->drop_count; i++)
            emit_op(s, OP_drop);
        if (top->label_finally != -1) {
            /* must push dummy value to keep same stack depth */
            emit_op(s, OP_undefined);
            emit_goto(s, OP_gosub, top->label_finally);
            emit_op(s, OP_drop);
        }
        top = top->prev;
    }
    if (name == JS_ATOM_NULL) {
        if (is_cont)
            return js_parse_error(s, "continue must be inside loop");
        else
            return js_parse_error(s, "break must be inside loop or switch");
    } else {
        return js_parse_error(s, "break/continue label not found");
    }
}